

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  long lVar1;
  Orphanage OVar2;
  Reader RVar3;
  Builder root;
  MallocMessageBuilder builder;
  StructBuilder local_178;
  OrphanBuilder local_148;
  ArrayPtr<const_unsigned_char> local_128;
  WirePointer *local_118;
  Builder local_110;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  OVar2 = MessageBuilder::getOrphanage(&local_f8.super_MessageBuilder);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&local_178,(EVP_PKEY_CTX *)OVar2.arena);
  local_148.segment = (SegmentBuilder *)local_178.capTable;
  local_148.capTable = (CapTableBuilder *)local_178.data;
  local_148.location = (word *)local_178.pointers;
  local_148.tag.content = (uint64_t)local_178.segment;
  RVar3 = OrphanBuilder::asDataReader(&local_148);
  if (RVar3.super_ArrayPtr<const_unsigned_char>.size_ == 3) {
    lVar1 = 0;
    do {
      if ("foo"[lVar1] != RVar3.super_ArrayPtr<const_unsigned_char>.ptr[lVar1]) goto LAB_001f9fee;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  else {
LAB_001f9fee:
    if (kj::_::Debug::minSeverity < 3) {
      local_178.segment = (SegmentBuilder *)0x2b7152;
      local_178.capTable = (CapTableBuilder *)0x3;
      local_128 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&local_148);
      kj::_::Debug::log<char_const(&)[55],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x119,ERROR,
                 "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", data(\"foo\"), orphan.getReader()"
                 ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
                 (Reader *)&local_178,(Reader *)&local_128);
    }
  }
  MessageBuilder::getRootInternal(&local_110,&local_f8.super_MessageBuilder);
  local_118 = local_110.builder.pointer;
  PointerBuilder::initStruct(&local_178,(PointerBuilder *)&local_128,(StructSize)0x140006);
  local_118 = local_178.pointers + 1;
  local_128.size_ = (size_t)local_178.capTable;
  local_128.ptr = (uchar *)local_178.segment;
  PointerBuilder::adopt((PointerBuilder *)&local_128,&local_148);
  if (local_148.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_148);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}